

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.h
# Opt level: O2

void __thiscall
entityx::SystemManager::add<entityx::deps::Dependency<A,B>>
          (SystemManager *this,shared_ptr<entityx::deps::Dependency<A,_B>_> *system)

{
  Family local_28;
  __shared_ptr<entityx::deps::Dependency<A,_B>,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_28 = System<entityx::deps::Dependency<A,_B>_>::family();
  Catch::clara::std::__shared_ptr<entityx::deps::Dependency<A,_B>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_20,
               &system->
                super___shared_ptr<entityx::deps::Dependency<A,_B>,_(__gnu_cxx::_Lock_policy)2>);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<entityx::BaseSystem>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<entityx::BaseSystem>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_long,std::shared_ptr<entityx::deps::Dependency<A,B>>>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<entityx::BaseSystem>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<entityx::BaseSystem>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->systems_,&local_28);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20._M_refcount);
  return;
}

Assistant:

void add(std::shared_ptr<S> system) {
    systems_.insert(std::make_pair(S::family(), system));
  }